

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_2.c
# Opt level: O0

longlong clear_flag(longlong wflg,longlong wbig,longlong *W,longlong n)

{
  longlong x;
  longlong n_local;
  longlong *W_local;
  longlong wbig_local;
  longlong wflg_local;
  
  if ((wflg < 2) || (wflg_local = wflg, wbig <= wflg)) {
    for (x = 0; x < n; x = x + 1) {
      if (W[x] != 0) {
        W[x] = 1;
      }
    }
    wflg_local = 2;
  }
  return wflg_local;
}

Assistant:

static Int clear_flag (Int wflg, Int wbig, Int W [ ], Int n)
{
    Int x ;
    if (wflg < 2 || wflg >= wbig)
    {
	for (x = 0 ; x < n ; x++)
	{
	    if (W [x] != 0) W [x] = 1 ;
	}
	wflg = 2 ;
    }
    /*  at this point, W [0..n-1] < wflg holds */
    return (wflg) ;
}